

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegExecGetValues(xmlRegExecCtxtPtr exec,int err,int *nbval,int *nbneg,xmlChar **values,
                       int *terminal)

{
  xmlRegexpPtr pxVar1;
  xmlRegTrans *pxVar2;
  long lVar3;
  xmlRegCounter *pxVar4;
  xmlRegStatePtr pxVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  xmlRegStatePtr pxVar12;
  ulong uVar13;
  undefined4 in_R10D;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  xmlChar *pxVar18;
  undefined1 auVar19 [16];
  
  auVar19._0_4_ = -(uint)(exec == (xmlRegExecCtxtPtr)0x0);
  auVar19._4_4_ = -(uint)(nbval == (int *)0x0);
  auVar19._8_4_ = -(uint)(nbneg == (int *)0x0);
  auVar19._12_4_ = -(uint)(values == (xmlChar **)0x0);
  iVar14 = movmskps(in_R10D,auVar19);
  iVar6 = -1;
  if ((iVar14 != 0) || (iVar14 = *nbval, iVar14 < 1)) {
    return -1;
  }
  *nbval = 0;
  *nbneg = 0;
  pxVar1 = exec->comp;
  if ((pxVar1 == (xmlRegexpPtr)0x0) || (pxVar1->compact == (int *)0x0)) {
    if (terminal != (int *)0x0) {
      *terminal = (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
    if (err == 0) {
      pxVar12 = exec->state;
    }
    else {
      pxVar12 = exec->errState;
    }
    if (pxVar12 != (xmlRegStatePtr)0x0) {
      lVar7 = 0x88;
      if (err == 0) {
        lVar7 = 0x40;
      }
      lVar15 = 0;
      lVar8 = 0x10;
      iVar9 = 0;
      while ((uVar13 = (ulong)pxVar12->nbTrans, lVar15 < (long)uVar13 && (iVar9 < iVar14))) {
        pxVar2 = pxVar12->trans;
        lVar16 = (long)*(int *)((long)pxVar2 + lVar8 + -8);
        if ((-1 < lVar16) &&
           (((lVar3 = *(long *)((long)pxVar2 + lVar8 + -0x10), lVar3 != 0 &&
             (pxVar18 = *(xmlChar **)(lVar3 + 0x18), pxVar18 != (xmlChar *)0x0)) &&
            ((*(uint *)((long)&pxVar2->atom + lVar8) & 0xfffffffe) != 0x123456)))) {
          lVar17 = (long)*(int *)((long)pxVar2 + lVar8 + -4);
          if (lVar17 < 0) {
            if (((exec->comp != (xmlRegexpPtr)0x0) &&
                (pxVar5 = exec->comp->states[lVar16], pxVar5 != (xmlRegStatePtr)0x0)) &&
               (pxVar5->type != XML_REGEXP_SINK_STATE)) goto LAB_00174e0e;
          }
          else if (((exec->comp == (xmlRegexpPtr)0x0) ||
                   (pxVar4 = exec->comp->counters, pxVar4 == (xmlRegCounter *)0x0)) ||
                  (*(int *)(*(long *)((long)&exec->status + lVar7) + lVar17 * 4) <
                   pxVar4[lVar17].max)) {
LAB_00174e0e:
            if (*(int *)(lVar3 + 0x28) != 0) {
              pxVar18 = *(xmlChar **)(lVar3 + 0x20);
            }
            values[iVar9] = pxVar18;
            iVar9 = iVar9 + 1;
            *nbval = *nbval + 1;
          }
        }
        lVar15 = lVar15 + 1;
        lVar8 = lVar8 + 0x18;
      }
      lVar7 = 0x10;
      iVar6 = 0;
      lVar8 = 0;
      while ((lVar8 < (int)uVar13 && (iVar9 < iVar14))) {
        pxVar2 = pxVar12->trans;
        lVar15 = (long)*(int *)((long)pxVar2 + lVar7 + -8);
        if (((-1 < lVar15) &&
            (((lVar16 = *(long *)((long)pxVar2 + lVar7 + -0x10), lVar16 != 0 &&
              (pxVar18 = *(xmlChar **)(lVar16 + 0x18), pxVar18 != (xmlChar *)0x0)) &&
             ((*(uint *)((long)&pxVar2->atom + lVar7) & 0xfffffffe) != 0x123456)))) &&
           (((*(int *)((long)pxVar2 + lVar7 + -4) < 0 &&
             (pxVar5 = exec->comp->states[lVar15], pxVar5 != (xmlRegStatePtr)0x0)) &&
            (pxVar5->type == XML_REGEXP_SINK_STATE)))) {
          if (*(int *)(lVar16 + 0x28) != 0) {
            pxVar18 = *(xmlChar **)(lVar16 + 0x20);
          }
          values[iVar9] = pxVar18;
          iVar9 = iVar9 + 1;
          *nbneg = *nbneg + 1;
          uVar13 = (ulong)(uint)pxVar12->nbTrans;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x18;
      }
    }
  }
  else {
    if (err == 0) {
      iVar9 = exec->index;
    }
    else {
      iVar9 = exec->errStateNo;
      if (iVar9 == -1) {
        return -1;
      }
    }
    if (terminal != (int *)0x0) {
      *terminal = (uint)(pxVar1->compact[(long)iVar9 * ((long)pxVar1->nbstrings + 1)] == 2);
    }
    lVar7 = 0;
    iVar10 = 0;
    while( true ) {
      uVar13 = (ulong)pxVar1->nbstrings;
      if (((long)uVar13 <= lVar7) || (iVar14 <= iVar10)) break;
      iVar11 = pxVar1->nbstrings + 1;
      iVar6 = pxVar1->compact[(long)(iVar11 * iVar9 + (int)lVar7) + 1];
      if (((0 < iVar6) && (iVar6 <= pxVar1->nbstates)) &&
         (pxVar1->compact[(iVar6 + -1) * iVar11] != 4)) {
        lVar8 = (long)iVar10;
        iVar10 = iVar10 + 1;
        values[lVar8] = pxVar1->stringMap[lVar7];
        *nbval = *nbval + 1;
      }
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    while ((iVar6 = 0, lVar7 < (int)uVar13 && (iVar6 = 0, iVar10 < iVar14))) {
      iVar11 = (int)uVar13 + 1;
      iVar6 = pxVar1->compact[(long)(iVar11 * iVar9 + (int)lVar7) + 1];
      if ((0 < iVar6) &&
         ((iVar6 <= pxVar1->nbstates && (pxVar1->compact[(iVar6 + -1) * iVar11] == 4)))) {
        lVar8 = (long)iVar10;
        iVar10 = iVar10 + 1;
        values[lVar8] = pxVar1->stringMap[lVar7];
        *nbneg = *nbneg + 1;
        uVar13 = (ulong)(uint)pxVar1->nbstrings;
      }
      lVar7 = lVar7 + 1;
    }
  }
  return iVar6;
}

Assistant:

static int
xmlRegExecGetValues(xmlRegExecCtxtPtr exec, int err,
                    int *nbval, int *nbneg,
		    xmlChar **values, int *terminal) {
    int maxval;
    int nb = 0;

    if ((exec == NULL) || (nbval == NULL) || (nbneg == NULL) ||
        (values == NULL) || (*nbval <= 0))
        return(-1);

    maxval = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp != NULL) && (exec->comp->compact != NULL)) {
        xmlRegexpPtr comp;
	int target, i, state;

        comp = exec->comp;

	if (err) {
	    if (exec->errStateNo == -1) return(-1);
	    state = exec->errStateNo;
	} else {
	    state = exec->index;
	}
	if (terminal != NULL) {
	    if (comp->compact[state * (comp->nbstrings + 1)] ==
	        XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] !=
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbval)++;
	    }
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] ==
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbneg)++;
	    }
	}
    } else {
        int transno;
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;
	xmlRegStatePtr state;

	if (terminal != NULL) {
	    if (exec->state->type == XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}

	if (err) {
	    if (exec->errState == NULL) return(-1);
	    state = exec->errState;
	} else {
	    if (exec->state == NULL) return(-1);
	    state = exec->state;
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        /* this should not be reached but ... */
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        /* this should not be reached but ... */
	    } else if (trans->counter >= 0) {
		xmlRegCounterPtr counter = NULL;
		int count;

		if (err)
		    count = exec->errCounts[trans->counter];
		else
		    count = exec->counts[trans->counter];
		if (exec->comp != NULL)
		    counter = &exec->comp->counters[trans->counter];
		if ((counter == NULL) || (count < counter->max)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    } else {
                if ((exec->comp != NULL) && (exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type !=
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    }
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        continue;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        continue;
	    } else if (trans->counter >= 0) {
	        continue;
	    } else {
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbneg)++;
		}
	    }
	}
    }
    return(0);
}